

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_bary3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv,REF_DBL *bary)

{
  REF_INT id;
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  REF_INT sens;
  REF_INT geom2;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT *local_70;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  
  uVar2 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv0,&sens);
  if (uVar2 == 0) {
    uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv1,&sens);
    if (uVar2 == 0) {
      uVar2 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,uv2,&sens);
      if (uVar2 == 0) {
        id = nodes[3];
        uVar2 = ref_geom_find(ref_geom,*nodes,2,id,&geom0);
        if (uVar2 == 0) {
          local_70 = ref_geom->descr;
          if (local_70[(long)geom0 * 6 + 4] != 0) {
            if (local_70[(long)geom0 * 6 + 4] < 1) {
              uv0[0] = *uv;
            }
            else {
              uv0[1] = uv[1];
            }
          }
          uVar2 = ref_geom_find(ref_geom,nodes[1],2,id,&geom1);
          if (uVar2 == 0) {
            if (local_70[(long)geom1 * 6 + 4] != 0) {
              if (local_70[(long)geom1 * 6 + 4] < 1) {
                uv1[0] = *uv;
              }
              else {
                uv1[1] = uv[1];
              }
            }
            uVar2 = ref_geom_find(ref_geom,nodes[2],2,id,&geom2);
            if (uVar2 == 0) {
              if (local_70[(long)geom2 * 6 + 4] != 0) {
                if (local_70[(long)geom2 * 6 + 4] < 1) {
                  uv2[0] = *uv;
                }
                else {
                  uv2[1] = uv[1];
                }
              }
              auVar8._0_8_ = uv1[0] * uv2[1] +
                             (((*uv * uv1[1] + (uv[1] * uv2[0] - uv1[0] * uv[1])) - uv2[0] * uv1[1])
                             - *uv * uv2[1]);
              *bary = auVar8._0_8_;
              dVar9 = *uv * uv2[1] +
                      (((uv0[0] * uv[1] + (uv2[0] * uv0[1] - *uv * uv0[1])) - uv2[0] * uv[1]) -
                      uv0[0] * uv2[1]);
              bary[1] = dVar9;
              dVar10 = uv1[0] * uv[1] +
                       (((uv0[0] * uv1[1] + (uv0[1] * *uv - uv1[0] * uv0[1])) - *uv * uv1[1]) -
                       uv0[0] * uv[1]);
              bary[2] = dVar10;
              dVar7 = auVar8._0_8_ + dVar9 + dVar10;
              auVar12._0_8_ = dVar7 * 1e+20;
              auVar12._8_8_ = auVar8._0_8_;
              auVar13._8_8_ = -auVar8._0_8_;
              auVar13._0_8_ = -auVar12._0_8_;
              auVar13 = maxpd(auVar12,auVar13);
              dVar11 = auVar13._0_8_;
              if (auVar13._8_8_ < dVar11) {
                dVar14 = dVar9;
                if (dVar9 <= -dVar9) {
                  dVar14 = -dVar9;
                }
                if (dVar14 < dVar11) {
                  dVar14 = dVar10;
                  if (dVar10 <= -dVar10) {
                    dVar14 = -dVar10;
                  }
                  if (dVar14 < dVar11) {
                    auVar8._8_8_ = dVar9;
                    auVar1._8_8_ = dVar7;
                    auVar1._0_8_ = dVar7;
                    auVar13 = divpd(auVar8,auVar1);
                    *(undefined1 (*) [16])bary = auVar13;
                    bary[2] = dVar10 / dVar7;
                    return 0;
                  }
                }
              }
              printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf4f,"ref_geom_bary3");
              for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
                bary[lVar3] = 0.0;
              }
              return 4;
            }
            uVar5 = (ulong)uVar2;
            pcVar6 = "g2";
            uVar4 = 0xf34;
          }
          else {
            uVar5 = (ulong)uVar2;
            pcVar6 = "g1";
            uVar4 = 0xf2b;
          }
        }
        else {
          uVar5 = (ulong)uVar2;
          pcVar6 = "g0";
          uVar4 = 0xf22;
        }
      }
      else {
        uVar5 = (ulong)uVar2;
        pcVar6 = "uv2";
        uVar4 = 0xf20;
      }
    }
    else {
      uVar5 = (ulong)uVar2;
      pcVar6 = "uv1";
      uVar4 = 0xf1e;
    }
  }
  else {
    uVar5 = (ulong)uVar2;
    pcVar6 = "uv0";
    uVar4 = 0xf1c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_bary3",uVar5,pcVar6);
  return (REF_STATUS)uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary3(REF_GEOM ref_geom, REF_INT *nodes,
                                  REF_DBL *uv, REF_DBL *bary) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  REF_DBL total;
  REF_INT geom0, geom1, geom2;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], &geom0), "g0");
  if (0 != ref_geom_degen(ref_geom, geom0)) {
    if (0 < ref_geom_degen(ref_geom, geom0)) {
      uv0[1] = uv[1];
    } else {
      uv0[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], &geom1), "g1");
  if (0 != ref_geom_degen(ref_geom, geom1)) {
    if (0 < ref_geom_degen(ref_geom, geom1)) {
      uv1[1] = uv[1];
    } else {
      uv1[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], &geom2), "g2");
  if (0 != ref_geom_degen(ref_geom, geom2)) {
    if (0 < ref_geom_degen(ref_geom, geom2)) {
      uv2[1] = uv[1];
    } else {
      uv2[0] = uv[0];
    }
  }

  bary[0] = -uv1[0] * uv[1] + uv2[0] * uv[1] + uv[0] * uv1[1] -
            uv2[0] * uv1[1] - uv[0] * uv2[1] + uv1[0] * uv2[1];
  bary[1] = -uv[0] * uv0[1] + uv2[0] * uv0[1] + uv0[0] * uv[1] -
            uv2[0] * uv[1] - uv0[0] * uv2[1] + uv[0] * uv2[1];
  bary[2] = -uv1[0] * uv0[1] + uv[0] * uv0[1] + uv0[0] * uv1[1] -
            uv[0] * uv1[1] - uv0[0] * uv[1] + uv1[0] * uv[1];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}